

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdbloom.cc
# Opt level: O1

bool __thiscall bloomFilter::test(bloomFilter *this,string *hex)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = this->mNoHashs == 0;
  if ((!bVar3) &&
     (uVar1 = (**(this->mHashFns).
                 super__Vector_base<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                 ._M_impl.super__Vector_impl_data._M_start)(hex),
     (this->mBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start[(int)uVar1] == '\x01')) {
    uVar2 = 1;
    do {
      bVar3 = this->mNoHashs <= uVar2;
      if (bVar3) {
        return bVar3;
      }
      uVar1 = (*(this->mHashFns).
                super__Vector_base<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar2])(hex);
      uVar2 = uVar2 + 1;
    } while ((this->mBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start[(int)uVar1] == '\x01');
  }
  return bVar3;
}

Assistant:

bool bloomFilter::test(const std::string &hex) {
	uint32_t (*hashfn)(const std::string &);
	uint32_t i;
	for (i = 0; i < mNoHashs; i++) {
		hashfn = mHashFns[i];

		int bit = hashfn(hex);

		if (!isBitSet(bit)) {
			return false;
		}
	}
	return true;
}